

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall
gss::innards::Proof::create_adjacency_constraint
          (Proof *this,int p,int q,int t,vector<int,_std::allocator<int>_> *uu,
          vector<int,_std::allocator<int>_> *cancel,bool param_6)

{
  _Tuple_impl<2UL,_int,_int> _Var1;
  _Tuple_impl<2UL,_int,_int> _Var2;
  int *piVar3;
  int *piVar4;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var5;
  mapped_type *pmVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  ostream *poVar8;
  long lVar9;
  int *u;
  int *piVar10;
  stringstream adjacency_constraint_to_recover;
  stringstream adjacency_constraint_for_opb;
  tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  tuple<int,_int,_int,_int> local_370;
  char local_360;
  undefined7 uStack_35f;
  undefined8 uStack_358;
  tuple<int,_int,_int,_int> local_350;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Head_base<1UL,_long,_false> local_320;
  _Head_base<0UL,_long,_false> local_318;
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (((this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->recover_encoding ==
      false) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"1 ~x",4);
    local_340._0_8_ = SEXT48(p);
    local_340._8_8_ = SEXT48(t);
    pmVar6 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
    piVar10 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    piVar3 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar10 != piVar3) {
      do {
        piVar4 = (cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start,piVar4,piVar10);
        if (piVar4 == _Var7._M_current) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," 1 x",4);
          local_340._8_8_ = SEXT48(*piVar10);
          local_340._0_8_ = (pointer)(long)q;
          pmVar6 = std::
                   map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                 _M_head_impl)->variable_mappings,(key_type *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
        }
        piVar10 = piVar10 + 1;
      } while (piVar10 != piVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >= 1",5);
    _Var5._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar9 = (_Var5._M_head_impl)->nb_constraints + 1;
    (_Var5._M_head_impl)->nb_constraints = lVar9;
    local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = q;
    local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)t;
    local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = 0;
    local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = p;
    std::__cxx11::stringbuf::str();
    _Var2 = (_Tuple_impl<2UL,_int,_int>)((long)local_340 + 0x10);
    _Var1 = (_Tuple_impl<2UL,_int,_int>)
            ((long)&local_3a0.
                    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl + 0x10);
    if ((_Tuple_impl<2UL,_int,_int>)
        local_3a0.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus._M_p == _Var1) {
      local_330._8_8_ =
           local_3a0.
           super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl.field_2._8_8_;
      local_340._0_8_ = _Var2;
    }
    else {
      local_340._0_8_ =
           local_3a0.
           super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p;
    }
    local_330._M_allocated_capacity =
         local_3a0.
         super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl.field_2._M_allocated_capacity;
    local_340._8_8_ =
         local_3a0.
         super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_string_length;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = 0;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity =
         local_3a0.
         super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)_Var1;
    local_320._M_head_impl = lVar9;
    local_318._M_head_impl = lVar9;
    std::
    _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
    ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,long,std::__cxx11::string>>
              ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
                *)&(_Var5._M_head_impl)->adjacency_lines,&local_370,
               (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_340);
    if ((_Tuple_impl<2UL,_int,_int>)local_340._0_8_ != _Var2) {
      operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<2UL,_int,_int>)
        local_3a0.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus._M_p != _Var1) {
      operator_delete(local_3a0.
                      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_3a0.
                      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(_Var5._M_head_impl)->field_0x50,(char *)local_340._0_8_,
                        local_340._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ;\n",3);
    if ((_Tuple_impl<2UL,_int,_int>)local_340._0_8_ != _Var2) {
      operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"1 ~x",4);
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)(long)p;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = (long)t;
    pmVar6 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_3a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),"1 ~x",4);
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)(long)p;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = (long)t;
    pmVar6 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_3a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_340 + 0x10),(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
    piVar10 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    piVar3 = (uu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar10 != piVar3) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," 1 x",4);
        local_3a0.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_string_length = (size_type)*piVar10;
        local_3a0.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus._M_p = (pointer)(long)q;
        pmVar6 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->variable_mappings,(key_type *)&local_3a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
        piVar4 = (cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((cancel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start,piVar4,piVar10);
        if (piVar4 == _Var7._M_current) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10)," 1 x",4)
          ;
          local_3a0.
          super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ._M_head_impl._M_string_length = (size_type)*piVar10;
          local_3a0.
          super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ._M_head_impl._M_dataplus._M_p = (pointer)(long)q;
          pmVar6 = std::
                   map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                 _M_head_impl)->variable_mappings,(key_type *)&local_3a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_340 + 0x10),(pmVar6->_M_dataplus)._M_p,
                     pmVar6->_M_string_length);
        }
        piVar10 = piVar10 + 1;
      } while (piVar10 != piVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >= 1",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10)," >= 1",5);
    _Var5._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar9 = (_Var5._M_head_impl)->nb_constraints + 1;
    (_Var5._M_head_impl)->nb_constraints = lVar9;
    local_350.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = 0;
    local_350.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)t;
    local_350.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = q;
    local_350.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = p;
    std::__cxx11::stringbuf::str();
    _Var1 = (_Tuple_impl<2UL,_int,_int>)
            ((long)&local_3a0.
                    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl + 0x10);
    if (local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int> == (_Tuple_impl<2UL,_int,_int>)&local_360) {
      local_3a0.
      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl.field_2._8_8_ = uStack_358;
      local_3a0.
      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = (pointer)_Var1;
    }
    else {
      local_3a0.
      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p =
           (pointer)local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
    }
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity._1_7_ = uStack_35f;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0] = local_360;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length._0_4_ =
         local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length._4_4_ =
         local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
         _M_head_impl;
    local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = 0;
    local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = 0;
    local_360 = '\0';
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_int,_false>._M_head_impl = 0;
    local_3a0.
    super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<0UL,_long,_false>._M_head_impl = lVar9;
    local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int> = (_Tuple_impl<2UL,_int,_int>)&local_360;
    std::
    _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
    ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,int,std::__cxx11::string>>
              ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
                *)&(_Var5._M_head_impl)->adjacency_lines,&local_350,&local_3a0);
    if ((_Tuple_impl<2UL,_int,_int>)
        local_3a0.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus._M_p != _Var1) {
      operator_delete(local_3a0.
                      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_3a0.
                      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    if (local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int> != (_Tuple_impl<2UL,_int,_int>)&local_360) {
      operator_delete((void *)local_370.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>
                      ,CONCAT71(uStack_35f,local_360) + 1);
    }
    _Var5._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(_Var5._M_head_impl)->field_0x50,
                        local_3a0.
                        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl._M_dataplus._M_p,
                        local_3a0.
                        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ;\n",3);
    if ((_Tuple_impl<2UL,_int,_int>)
        local_3a0.
        super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus._M_p != _Var1) {
      operator_delete(local_3a0.
                      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_3a0.
                      super__Tuple_impl<0UL,_long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

auto Proof::create_adjacency_constraint(int p, int q, int t, const vector<int> & uu, const vector<int> & cancel,
        bool) -> void
{
    if (! _imp->recover_encoding) {
        stringstream adjacency_constraint;
        adjacency_constraint << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        for (auto & u : uu)
            if (cancel.end() == find(cancel.begin(), cancel.end(), u))
                adjacency_constraint << " 1 x" << _imp->variable_mappings[pair{q, u}];
        adjacency_constraint << " >= 1";
        long n = ++_imp->nb_constraints;
        _imp->adjacency_lines.emplace(tuple{0, p, q, t}, tuple{n, n, adjacency_constraint.str()});
        _imp->model_stream << adjacency_constraint.str() << " ;\n";
    }
    else {
        stringstream adjacency_constraint_for_opb, adjacency_constraint_to_recover;
        adjacency_constraint_for_opb << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        adjacency_constraint_to_recover << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        for (auto & u : uu) {
            adjacency_constraint_for_opb << " 1 x" << _imp->variable_mappings[pair{q, u}];
            if (cancel.end() == find(cancel.begin(), cancel.end(), u))
                adjacency_constraint_to_recover << " 1 x" << _imp->variable_mappings[pair{q, u}];
        }
        adjacency_constraint_for_opb << " >= 1";
        adjacency_constraint_to_recover << " >= 1";

        long n = ++_imp->nb_constraints;
        _imp->adjacency_lines.emplace(tuple{0, p, q, t}, tuple{n, 0, adjacency_constraint_to_recover.str()});
        _imp->model_stream << adjacency_constraint_for_opb.str() << " ;\n";
    }
}